

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O0

void __thiscall
duckdb::LogManager::WriteLogEntry
          (LogManager *this,timestamp_t timestamp,char *log_type,LogLevel log_level,
          char *log_message,RegisteredLoggingContext *context)

{
  LogStorage *pLVar1;
  byte in_CL;
  char *in_RDX;
  undefined8 in_RSI;
  unique_lock<std::mutex> *in_R8;
  undefined8 in_R9;
  unique_lock<std::mutex> lck;
  mutex_type *in_stack_ffffffffffffff18;
  unique_lock<std::mutex> *in_stack_ffffffffffffff20;
  allocator aStack_a1;
  string asStack_a0 [39];
  allocator aStack_79;
  string asStack_78 [32];
  undefined8 uStack_58;
  undefined8 uStack_30;
  unique_lock<std::mutex> *puStack_28;
  byte bStack_19;
  char *pcStack_18;
  undefined8 uStack_8;
  
  uStack_30 = in_R9;
  puStack_28 = in_R8;
  bStack_19 = in_CL;
  pcStack_18 = in_RDX;
  uStack_8 = in_RSI;
  ::std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pLVar1 = shared_ptr<duckdb::LogStorage,_true>::operator->
                     ((shared_ptr<duckdb::LogStorage,_true> *)in_stack_ffffffffffffff20);
  uStack_58 = uStack_8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_78,pcStack_18,&aStack_79);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_a0,(char *)puStack_28,&aStack_a1);
  (*pLVar1->_vptr_LogStorage[2])(pLVar1,uStack_58,(ulong)bStack_19,asStack_78,asStack_a0,uStack_30);
  ::std::__cxx11::string::~string(asStack_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&aStack_a1);
  ::std::__cxx11::string::~string(asStack_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&aStack_79);
  ::std::unique_lock<std::mutex>::~unique_lock(puStack_28);
  return;
}

Assistant:

void LogManager::WriteLogEntry(timestamp_t timestamp, const char *log_type, LogLevel log_level, const char *log_message,
                               const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);
	log_storage->WriteLogEntry(timestamp, log_level, log_type, log_message, context);
}